

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::Transform(ON_PolyCurve *this,ON_Xform *xform)

{
  ON_Curve *pOVar1;
  char cVar2;
  ulong uVar4;
  ulong uVar5;
  int iVar3;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  uVar5 = (ulong)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if ((long)uVar5 < 1) {
    cVar2 = '\0';
  }
  else {
    uVar4 = 1;
    do {
      pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4 - 1];
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar1,xform);
      cVar2 = (char)iVar3;
      if (uVar5 <= uVar4) {
        return (bool)cVar2;
      }
      uVar4 = uVar4 + 1;
    } while (cVar2 != '\0');
  }
  return (bool)cVar2;
}

Assistant:

bool
ON_PolyCurve::Transform( const ON_Xform& xform )
{
  TransformUserData(xform);
  DestroyRuntimeCache();
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->Transform( xform );
  }
  return rc;
}